

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O2

char ** iniparser_getseckeys(dictionary *d,char *s,char **keys)

{
  char *__s1;
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char keym [1025];
  char local_438 [1032];
  
  if (keys != (char **)0x0 && d != (dictionary *)0x0) {
    iVar1 = iniparser_find_entry(d,s);
    uVar4 = 0;
    if (iVar1 == 0) {
      keys = (char **)0x0;
    }
    else {
      sVar2 = strlen(s);
      sprintf(local_438,"%s:",s);
      uVar5 = d->size;
      if (d->size < 1) {
        uVar5 = uVar4;
      }
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        __s1 = d->key[uVar3];
        if ((__s1 != (char *)0x0) &&
           (iVar1 = strncmp(__s1,local_438,(long)((int)sVar2 + 1)), iVar1 == 0)) {
          keys[(int)uVar4] = __s1;
          uVar4 = (ulong)((int)uVar4 + 1);
        }
      }
    }
    return keys;
  }
  return (char **)0x0;
}

Assistant:

const char ** iniparser_getseckeys(const dictionary * d, const char * s, const char ** keys)
{
    int i, j, seclen ;
    char keym[ASCIILINESZ+1];

    if (d==NULL || keys==NULL) return NULL;
    if (! iniparser_find_entry(d, s)) return NULL;

    seclen  = (int)strlen(s);
    sprintf(keym, "%s:", s);

    i = 0;

    for (j=0 ; j<d->size ; j++) {
        if (d->key[j]==NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen+1)) {
            keys[i] = d->key[j];
            i++;
        }
    }

    return keys;
}